

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

int EVP_PKEY_cmp_parameters(EVP_PKEY *a,EVP_PKEY *b)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  iVar1 = -1;
  if (a->save_type == b->save_type) {
    iVar1 = -2;
    if ((a->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
       (UNRECOVERED_JUMPTABLE = *(code **)(a->ameth + 0x98), UNRECOVERED_JUMPTABLE != (code *)0x0))
    {
      iVar1 = (*UNRECOVERED_JUMPTABLE)();
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int EVP_PKEY_cmp_parameters(const EVP_PKEY *a, const EVP_PKEY *b) {
  if (a->type != b->type) {
    return -1;
  }
  if (a->ameth && a->ameth->param_cmp) {
    return a->ameth->param_cmp(a, b);
  }
  // TODO(https://crbug.com/boringssl/536): If the algorithm doesn't use
  // parameters, they should compare as vacuously equal.
  return -2;
}